

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::writeMatrixConstructor<2,2>
               (ostream *str,Matrix<float,_2,_2> *m)

{
  byte bVar1;
  byte bVar2;
  Matrix<float,_2,_2> *pMVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  int precision;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  long lVar8;
  bool bVar9;
  string local_58;
  Matrix<float,_2,_2> *local_38;
  
  local_38 = m;
  std::__ostream_insert<char,std::char_traits<char>>(str,"mat",3);
  std::ostream::operator<<(str,2);
  std::__ostream_insert<char,std::char_traits<char>>(str,"(",1);
  bVar1 = 0;
  lVar5 = 0;
  uVar7 = extraout_RDX;
  bVar4 = true;
  do {
    bVar6 = bVar4;
    pMVar3 = local_38;
    bVar2 = 0;
    lVar8 = 0;
    bVar4 = true;
    do {
      bVar9 = bVar4;
      precision = (int)uVar7;
      if ((bool)(bVar2 | bVar1)) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
        precision = extraout_EDX;
      }
      de::floatToString_abi_cxx11_
                (&local_58,(de *)&DAT_00000001,(pMVar3->m_data).m_data[lVar5].m_data[lVar8],
                 precision);
      std::__ostream_insert<char,std::char_traits<char>>
                (str,local_58._M_dataplus._M_p,local_58._M_string_length);
      uVar7 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        uVar7 = extraout_RDX_01;
      }
      lVar8 = 1;
      bVar2 = 1;
      bVar4 = false;
    } while (bVar9);
    lVar5 = 1;
    bVar1 = 1;
    bVar4 = false;
  } while (bVar6);
  std::__ostream_insert<char,std::char_traits<char>>(str,")",1);
  return;
}

Assistant:

void writeMatrixConstructor (std::ostream& str, const tcu::Matrix<float, Rows, Cols>& m)
{
	if (Rows == Cols)
		str << "mat" << Cols;
	else
		str << "mat" << Cols << "x" << Rows;

	str << "(";
	for (int colNdx = 0; colNdx < Cols; colNdx++)
	{
		for (int rowNdx = 0; rowNdx < Rows; rowNdx++)
		{
			if (rowNdx > 0 || colNdx > 0)
				str << ", ";
			str << de::floatToString(m(rowNdx, colNdx), 1);
		}
	}
	str << ")";
}